

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

DEBUG_NB10 * __thiscall DebugDirEntryWrapper::getNB10(DebugDirEntryWrapper *this)

{
  DEBUG_NB10 *pDVar1;
  IMAGE_DEBUG_DIRECTORY *pIVar2;
  DEBUG_NB10 *pDVar3;
  
  pDVar1 = (DEBUG_NB10 *)getDebugStruct(this);
  pIVar2 = debugDir(this);
  if ((pIVar2 == (IMAGE_DEBUG_DIRECTORY *)0x0 || pDVar1 == (DEBUG_NB10 *)0x0) ||
     (pIVar2->SizeOfData < 0x11)) {
    pDVar3 = (DEBUG_NB10 *)0x0;
  }
  else {
    pDVar3 = (DEBUG_NB10 *)0x0;
    if ((pDVar1->cvHdr).CvSignature == 0x3031424e) {
      pDVar3 = pDVar1;
    }
  }
  return pDVar3;
}

Assistant:

pe::DEBUG_NB10* DebugDirEntryWrapper::getNB10()
{
    BYTE* debugStr = getDebugStruct();
    IMAGE_DEBUG_DIRECTORY* d = debugDir();
    if (!debugStr || !d) return NULL;
    if (d->SizeOfData < sizeof(DEBUG_NB10)) {
        return NULL;
    }
    DEBUG_NB10* nb = (DEBUG_NB10*)debugStr;
    if (nb->cvHdr.CvSignature == CV_SIGNATURE_NB10) {
        return nb;
    }
    return NULL;
}